

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<56,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  keytype k;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  bool in_stack_0000008b;
  bool in_stack_0000008c;
  bool in_stack_0000008d;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffc0;
  byte bVar6;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 inclusive_00;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  pfHash in_stack_ffffffffffffffd0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x38,pcVar5,(ulong)in_ESI);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x15dd31);
  Blob<56>::Blob((Blob<56> *)&stack0xffffffffffffffd1);
  memset(&stack0xffffffffffffffd1,0,7);
  if ((local_d & 1) != 0) {
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),CONCAT44(in_ESI,in_EDX)
              );
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xffffffffffffffd1,7,0,pvVar3);
  }
  inclusive_00 = (undefined1)((uint)in_stack_ffffffffffffffc4 >> 0x18);
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<56>,Blob<128>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (bool)inclusive_00,(Blob<56> *)CONCAT44(in_ESI,in_EDX),
             (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ECX,in_R8D));
  sVar4 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<Blob<128>>
                    (in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d,
                     in_stack_0000008c,in_stack_0000008b);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ECX,in_R8D));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}